

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O1

void __thiscall peg::LiteralString::LiteralString(LiteralString *this,string *s,bool ignore_case)

{
  pointer pcVar1;
  
  (this->super_enable_shared_from_this<peg::LiteralString>)._M_weak_this.
  super___weak_ptr<peg::LiteralString,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<peg::LiteralString>)._M_weak_this.
  super___weak_ptr<peg::LiteralString,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Ope)._vptr_Ope = (_func_int **)&PTR__LiteralString_00171e30;
  (this->lit_)._M_dataplus._M_p = (pointer)&(this->lit_).field_2;
  pcVar1 = (s->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lit_,pcVar1,pcVar1 + s->_M_string_length);
  this->ignore_case_ = ignore_case;
  (this->init_is_word_)._M_once = 0;
  this->is_word_ = false;
  return;
}

Assistant:

LiteralString(const std::string &s, bool ignore_case)
      : lit_(s), ignore_case_(ignore_case), is_word_(false) {}